

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O1

void __thiscall
efsw::DirWatcherGeneric::DirWatcherGeneric
          (DirWatcherGeneric *this,DirWatcherGeneric *parent,WatcherGeneric *ws,string *directory,
          bool recursive,bool reportNewFiles)

{
  DirectorySnapshot *this_00;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  bool bVar3;
  _Self __tmp;
  _List_node_base *p_Var4;
  DirectorySnapshotDiff *this_01;
  char *__end;
  DirectorySnapshotDiff Diff;
  string local_200;
  string local_1e0;
  DirectorySnapshotDiff local_1c0;
  DirectorySnapshotDiff local_f8;
  
  this->Parent = parent;
  this->Watch = ws;
  this_00 = &this->DirSnap;
  DirectorySnapshot::DirectorySnapshot(this_00);
  p_Var1 = &(this->Directories)._M_t._M_impl.super__Rb_tree_header;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Recursive = recursive;
  this->Deleted = false;
  pcVar2 = (directory->_M_dataplus)._M_p;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar2,pcVar2 + directory->_M_string_length);
  resetDirectory(this,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (reportNewFiles) {
    DirectorySnapshot::scan(&local_1c0,this_00);
    bVar3 = DirectorySnapshotDiff::changed(&local_1c0);
    if (bVar3) {
      if (local_1c0.FilesCreated.super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
          _M_impl._M_node.super__List_node_base._M_next !=
          (_List_node_base *)&local_1c0.FilesCreated) {
        p_Var4 = local_1c0.FilesCreated.
                 super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        do {
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"","");
          handleAction(this,(string *)(p_Var4 + 1),1,&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          p_Var4 = p_Var4->_M_next;
        } while (p_Var4 != (_List_node_base *)&local_1c0.FilesCreated);
      }
    }
    std::__cxx11::
    _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::_M_clear(&local_1c0.DirsMoved.
                super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              );
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_1c0.DirsModified.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_1c0.DirsCreated.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_1c0.DirsDeleted.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    std::__cxx11::
    _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::_M_clear(&local_1c0.FilesMoved.
                super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              );
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_1c0.FilesModified.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_1c0.FilesCreated.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    this_01 = &local_1c0;
  }
  else {
    DirectorySnapshot::scan(&local_f8,this_00);
    std::__cxx11::
    _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::_M_clear(&local_f8.DirsMoved.
                super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              );
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_f8.DirsModified.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_f8.DirsCreated.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_f8.DirsDeleted.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    std::__cxx11::
    _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
    ::_M_clear(&local_f8.FilesMoved.
                super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
              );
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_f8.FilesModified.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
              (&local_f8.FilesCreated.
                super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
    this_01 = &local_f8;
  }
  std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
            ((_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)this_01);
  return;
}

Assistant:

DirWatcherGeneric::DirWatcherGeneric( DirWatcherGeneric * parent, WatcherGeneric * ws, const std::string& directory, bool recursive, bool reportNewFiles ) :
	Parent( parent ),
	Watch( ws ),
	Recursive( recursive ),
	Deleted( false )
{
	resetDirectory( directory );

	if ( !reportNewFiles )
	{
		DirSnap.scan();
	}
	else
	{
		DirectorySnapshotDiff Diff = DirSnap.scan();

		if ( Diff.changed() )
		{
			FileInfoList::iterator it;

			DiffIterator( FilesCreated )
			{
				handleAction( ( *it ).Filepath, Actions::Add );
			}
		}
	}
}